

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ethread.c
# Opt level: O0

void av1_init_mt_sync(AV1_COMP *cpi,int is_first_pass)

{
  long lVar1;
  long lVar2;
  long lVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  void *pvVar8;
  int in_ESI;
  long *in_RDI;
  AV1EncPackBSSync *pack_bs_sync;
  int num_lr_workers;
  int num_rows_lr;
  int rst_unit_size;
  AV1LrSync *lr_sync;
  AV1TplRowMultiThreadInfo *tpl_row_mt;
  int num_lf_workers;
  PrimaryMultiThreadInfo *p_mt_info;
  int sb_rows;
  AV1LfSync *lf_sync;
  AV1CdefSync *cdef_sync;
  AV1TemporalFilterSync *tf_sync;
  AV1GlobalMotionSync *gm_sync;
  AV1EncRowMultiThreadInfo *enc_row_mt;
  MultiThreadInfo *mt_info;
  AV1_COMMON *cm;
  aom_internal_error_info *in_stack_ffffffffffffff78;
  long *plVar9;
  int in_stack_ffffffffffffff80;
  int in_stack_ffffffffffffff84;
  undefined4 in_stack_ffffffffffffff88;
  undefined4 in_stack_ffffffffffffff8c;
  AV1LfSync *in_stack_ffffffffffffff90;
  AV1LrSync *lr_sync_00;
  AV1_COMMON *cm_00;
  undefined4 in_stack_ffffffffffffffa0;
  
  iVar4 = _setjmp((__jmp_buf_tag *)(in_RDI[0x77f6] + 0xd8));
  if (iVar4 != 0) {
    *(undefined4 *)(in_RDI[0x77f6] + 0xd0) = 0;
    aom_internal_error_copy
              ((aom_internal_error_info *)
               CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
               in_stack_ffffffffffffff78);
  }
  iVar4 = (int)((ulong)in_stack_ffffffffffffff78 >> 0x20);
  *(undefined4 *)(in_RDI[0x77f6] + 0xd0) = 1;
  if ((in_ESI != 0) || ((*(byte *)((long)in_RDI + 0x42771) & 1) == 1)) {
    if (in_RDI[0x135f7] == 0) {
      pvVar8 = aom_malloc(0x25ae35);
      in_RDI[0x135f7] = (long)pvVar8;
      if (in_RDI[0x135f7] == 0) {
        aom_internal_error((aom_internal_error_info *)in_RDI[0x77f6],AOM_CODEC_MEM_ERROR,
                           "Failed to allocate enc_row_mt->mutex_");
      }
      if (in_RDI[0x135f7] != 0) {
        pthread_mutex_init((pthread_mutex_t *)in_RDI[0x135f7],(pthread_mutexattr_t *)0x0);
      }
    }
    if (in_RDI[0x135f8] == 0) {
      pvVar8 = aom_malloc(0x25aeb2);
      in_RDI[0x135f8] = (long)pvVar8;
      if (in_RDI[0x135f8] == 0) {
        aom_internal_error((aom_internal_error_info *)in_RDI[0x77f6],AOM_CODEC_MEM_ERROR,
                           "Failed to allocate enc_row_mt->cond_");
      }
      if (in_RDI[0x135f8] != 0) {
        pthread_cond_init((pthread_cond_t *)in_RDI[0x135f8],(pthread_condattr_t *)0x0);
      }
    }
  }
  if (in_ESI == 0) {
    if (in_RDI[0x13a2e] == 0) {
      pvVar8 = aom_malloc(0x25af49);
      in_RDI[0x13a2e] = (long)pvVar8;
      if (in_RDI[0x13a2e] == 0) {
        aom_internal_error((aom_internal_error_info *)in_RDI[0x77f6],AOM_CODEC_MEM_ERROR,
                           "Failed to allocate gm_sync->mutex_");
      }
      if (in_RDI[0x13a2e] != 0) {
        pthread_mutex_init((pthread_mutex_t *)in_RDI[0x13a2e],(pthread_mutexattr_t *)0x0);
      }
    }
    plVar9 = in_RDI + 0x13a30;
    if (*plVar9 == 0) {
      pvVar8 = aom_malloc(0x25afc6);
      *plVar9 = (long)pvVar8;
      if (*plVar9 == 0) {
        aom_internal_error((aom_internal_error_info *)in_RDI[0x77f6],AOM_CODEC_MEM_ERROR,
                           "Failed to allocate tf_sync->mutex_");
      }
      if (*plVar9 != 0) {
        pthread_mutex_init((pthread_mutex_t *)*plVar9,(pthread_mutexattr_t *)0x0);
      }
    }
    plVar9 = in_RDI + 0x13a32;
    if (*plVar9 == 0) {
      pvVar8 = aom_malloc(0x25b03f);
      *plVar9 = (long)pvVar8;
      if (*plVar9 == 0) {
        aom_internal_error((aom_internal_error_info *)in_RDI[0x77f6],AOM_CODEC_MEM_ERROR,
                           "Failed to allocate cdef_sync->mutex_");
      }
      if (*plVar9 != 0) {
        pthread_mutex_init((pthread_mutex_t *)*plVar9,(pthread_mutexattr_t *)0x0);
      }
    }
    iVar6 = *(int *)((long)in_RDI + 0x3bfbc);
    lVar1 = *in_RDI;
    iVar5 = av1_get_num_mod_workers_for_alloc((PrimaryMultiThreadInfo *)(lVar1 + 0x123d0),MOD_LPF);
    if ((((int)in_RDI[0x1360c] == 0) ||
        ((iVar6 >> 2) + 0x1f >> 5 != *(int *)((long)in_RDI + 0x9b064))) ||
       ((int)in_RDI[0x1360e] < iVar5)) {
      av1_loop_filter_dealloc
                ((AV1LfSync *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80));
      av1_loop_filter_alloc
                (in_stack_ffffffffffffff90,
                 (AV1_COMMON *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88),
                 in_stack_ffffffffffffff84,in_stack_ffffffffffffff80,iVar4);
    }
    cm_00 = (AV1_COMMON *)(in_RDI + 0x135ff);
    if (in_RDI[0x13600] == 0) {
      pvVar8 = aom_malloc(0x25b15b);
      *(void **)&(cm_00->current_frame).display_order_hint = pvVar8;
      lVar2._0_4_ = (cm_00->current_frame).display_order_hint;
      lVar2._4_4_ = (cm_00->current_frame).pyramid_level;
      if (lVar2 == 0) {
        aom_internal_error((aom_internal_error_info *)in_RDI[0x77f6],AOM_CODEC_MEM_ERROR,
                           "Failed to allocate tpl_row_mt->mutex_");
      }
      lVar3._0_4_ = (cm_00->current_frame).display_order_hint;
      lVar3._4_4_ = (cm_00->current_frame).pyramid_level;
      if (lVar3 != 0) {
        pthread_mutex_init(*(pthread_mutex_t **)&(cm_00->current_frame).display_order_hint,
                           (pthread_mutexattr_t *)0x0);
      }
    }
    iVar4 = is_restoration_used((AV1_COMMON *)(in_RDI + 0x77f0));
    if (iVar4 != 0) {
      lr_sync_00 = (AV1LrSync *)(in_RDI + 0x13613);
      iVar4 = (int)in_RDI[0xc18f];
      iVar6 = av1_lr_count_units(iVar4,*(int *)((long)in_RDI + 0x3bfbc));
      iVar7 = av1_get_num_mod_workers_for_alloc((PrimaryMultiThreadInfo *)(lVar1 + 0x123d0),MOD_LR);
      if (((lr_sync_00->sync_range == 0) || (lr_sync_00->rows < iVar6)) ||
         ((lr_sync_00->num_workers < iVar7 || (lr_sync_00->num_planes < 3)))) {
        av1_loop_restoration_dealloc(lr_sync_00);
        av1_loop_restoration_alloc
                  ((AV1LrSync *)CONCAT44(iVar5,in_stack_ffffffffffffffa0),cm_00,
                   (int)((ulong)lr_sync_00 >> 0x20),(int)lr_sync_00,iVar4,iVar6);
      }
    }
    plVar9 = in_RDI + 0x13623;
    if (*plVar9 == 0) {
      pvVar8 = aom_malloc(0x25b29b);
      *plVar9 = (long)pvVar8;
      if (*plVar9 == 0) {
        aom_internal_error((aom_internal_error_info *)in_RDI[0x77f6],AOM_CODEC_MEM_ERROR,
                           "Failed to allocate pack_bs_sync->mutex_");
      }
      if (*plVar9 != 0) {
        pthread_mutex_init((pthread_mutex_t *)*plVar9,(pthread_mutexattr_t *)0x0);
      }
    }
  }
  *(undefined4 *)(in_RDI[0x77f6] + 0xd0) = 0;
  return;
}

Assistant:

void av1_init_mt_sync(AV1_COMP *cpi, int is_first_pass) {
  AV1_COMMON *const cm = &cpi->common;
  MultiThreadInfo *const mt_info = &cpi->mt_info;

  if (setjmp(cm->error->jmp)) {
    cm->error->setjmp = 0;
    aom_internal_error_copy(&cpi->ppi->error, cm->error);
  }
  cm->error->setjmp = 1;
  // Initialize enc row MT object.
  if (is_first_pass || cpi->oxcf.row_mt == 1) {
    AV1EncRowMultiThreadInfo *enc_row_mt = &mt_info->enc_row_mt;
    if (enc_row_mt->mutex_ == NULL) {
      CHECK_MEM_ERROR(cm, enc_row_mt->mutex_,
                      aom_malloc(sizeof(*(enc_row_mt->mutex_))));
      if (enc_row_mt->mutex_) pthread_mutex_init(enc_row_mt->mutex_, NULL);
    }
    if (enc_row_mt->cond_ == NULL) {
      CHECK_MEM_ERROR(cm, enc_row_mt->cond_,
                      aom_malloc(sizeof(*(enc_row_mt->cond_))));
      if (enc_row_mt->cond_) pthread_cond_init(enc_row_mt->cond_, NULL);
    }
  }

  if (!is_first_pass) {
    // Initialize global motion MT object.
    AV1GlobalMotionSync *gm_sync = &mt_info->gm_sync;
    if (gm_sync->mutex_ == NULL) {
      CHECK_MEM_ERROR(cm, gm_sync->mutex_,
                      aom_malloc(sizeof(*(gm_sync->mutex_))));
      if (gm_sync->mutex_) pthread_mutex_init(gm_sync->mutex_, NULL);
    }
#if !CONFIG_REALTIME_ONLY
    // Initialize temporal filtering MT object.
    AV1TemporalFilterSync *tf_sync = &mt_info->tf_sync;
    if (tf_sync->mutex_ == NULL) {
      CHECK_MEM_ERROR(cm, tf_sync->mutex_,
                      aom_malloc(sizeof(*tf_sync->mutex_)));
      if (tf_sync->mutex_) pthread_mutex_init(tf_sync->mutex_, NULL);
    }
#endif  // !CONFIG_REALTIME_ONLY
        // Initialize CDEF MT object.
    AV1CdefSync *cdef_sync = &mt_info->cdef_sync;
    if (cdef_sync->mutex_ == NULL) {
      CHECK_MEM_ERROR(cm, cdef_sync->mutex_,
                      aom_malloc(sizeof(*(cdef_sync->mutex_))));
      if (cdef_sync->mutex_) pthread_mutex_init(cdef_sync->mutex_, NULL);
    }

    // Initialize loop filter MT object.
    AV1LfSync *lf_sync = &mt_info->lf_row_sync;
    // Number of superblock rows
    const int sb_rows =
        CEIL_POWER_OF_TWO(cm->height >> MI_SIZE_LOG2, MAX_MIB_SIZE_LOG2);
    PrimaryMultiThreadInfo *const p_mt_info = &cpi->ppi->p_mt_info;
    int num_lf_workers = av1_get_num_mod_workers_for_alloc(p_mt_info, MOD_LPF);

    if (!lf_sync->sync_range || sb_rows != lf_sync->rows ||
        num_lf_workers > lf_sync->num_workers) {
      av1_loop_filter_dealloc(lf_sync);
      av1_loop_filter_alloc(lf_sync, cm, sb_rows, cm->width, num_lf_workers);
    }

    // Initialize tpl MT object.
    AV1TplRowMultiThreadInfo *tpl_row_mt = &mt_info->tpl_row_mt;
    if (tpl_row_mt->mutex_ == NULL) {
      CHECK_MEM_ERROR(cm, tpl_row_mt->mutex_,
                      aom_malloc(sizeof(*(tpl_row_mt->mutex_))));
      if (tpl_row_mt->mutex_) pthread_mutex_init(tpl_row_mt->mutex_, NULL);
    }

#if !CONFIG_REALTIME_ONLY
    if (is_restoration_used(cm)) {
      // Initialize loop restoration MT object.
      AV1LrSync *lr_sync = &mt_info->lr_row_sync;
      int rst_unit_size = cpi->sf.lpf_sf.min_lr_unit_size;
      int num_rows_lr = av1_lr_count_units(rst_unit_size, cm->height);
      int num_lr_workers = av1_get_num_mod_workers_for_alloc(p_mt_info, MOD_LR);
      if (!lr_sync->sync_range || num_rows_lr > lr_sync->rows ||
          num_lr_workers > lr_sync->num_workers ||
          MAX_MB_PLANE > lr_sync->num_planes) {
        av1_loop_restoration_dealloc(lr_sync);
        av1_loop_restoration_alloc(lr_sync, cm, num_lr_workers, num_rows_lr,
                                   MAX_MB_PLANE, cm->width);
      }
    }
#endif

    // Initialization of pack bitstream MT object.
    AV1EncPackBSSync *pack_bs_sync = &mt_info->pack_bs_sync;
    if (pack_bs_sync->mutex_ == NULL) {
      CHECK_MEM_ERROR(cm, pack_bs_sync->mutex_,
                      aom_malloc(sizeof(*pack_bs_sync->mutex_)));
      if (pack_bs_sync->mutex_) pthread_mutex_init(pack_bs_sync->mutex_, NULL);
    }
  }
  cm->error->setjmp = 0;
}